

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void decode_abs_storeb_h(DisasContext_conflict14 *ctx)

{
  int iVar1;
  TCGContext_conflict9 *tcg_ctx;
  TCGContext_conflict9 *tcg_ctx_00;
  TCGContext_conflict9 *tcg_ctx_01;
  TCGv_i32 addr;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uint uVar4;
  uintptr_t o_1;
  MemOp memop;
  uint uVar5;
  uintptr_t o;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar4 = ctx->opcode;
  uVar5 = uVar4 >> 8 & 0xf;
  addr = tcg_const_i32_tricore
                   (tcg_ctx,(uVar4 & 0xf000) << 0x10 |
                            uVar4 >> 0xc & 0x3c00 |
                            uVar4 >> 0x16 & 0xffffffc0 | uVar4 >> 0x10 & 0x3f);
  uVar4 = uVar4 >> 0x1a & 3;
  if ((short)uVar4 == 2) {
    pTVar2 = tcg_ctx->cpu_gpr_d[uVar5];
    iVar1 = ctx->mem_idx;
    memop = MO_16;
  }
  else {
    if (uVar4 != 0) {
      tcg_ctx_00 = ctx->uc->tcg_ctx;
      pTVar2 = tcg_const_i32_tricore(tcg_ctx_00,2);
      pTVar3 = tcg_const_i32_tricore(tcg_ctx_00,1);
      tcg_ctx_01 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(tcg_ctx_01,INDEX_op_movi_i32,
                          (TCGArg)(tcg_ctx_01->cpu_PC + (long)tcg_ctx_01),
                          (long)(int)(ctx->base).pc_next);
      local_48 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
      local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx_00);
      local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx_00);
      tcg_gen_callN_tricore(tcg_ctx_00,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_48);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar2 + (long)tcg_ctx_00));
      tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar3 + (long)tcg_ctx_00));
      goto LAB_00d2359e;
    }
    pTVar2 = tcg_ctx->cpu_gpr_d[uVar5];
    iVar1 = ctx->mem_idx;
    memop = MO_8;
  }
  tcg_gen_qemu_st_i32_tricore(tcg_ctx,pTVar2,addr,(long)iVar1,memop);
LAB_00d2359e:
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  return;
}

Assistant:

static void decode_abs_storeb_h(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    int32_t op2;
    int32_t r1;
    uint32_t address;
    TCGv temp;

    r1 = MASK_OP_ABS_S1D(ctx->opcode);
    address = MASK_OP_ABS_OFF18(ctx->opcode);
    op2 = MASK_OP_ABS_OP2(ctx->opcode);

    temp = tcg_const_i32(tcg_ctx, EA_ABS_FORMAT(address));

    switch (op2) {
    case OPC2_32_ABS_ST_B:
        tcg_gen_qemu_st_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r1], temp, ctx->mem_idx, MO_UB);
        break;
    case OPC2_32_ABS_ST_H:
        tcg_gen_qemu_st_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r1], temp, ctx->mem_idx, MO_LEUW);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
    tcg_temp_free(tcg_ctx, temp);
}